

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::
RMatrixLimited<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (RMatrixLimited *this,bool ifg,bool krl,int krm,int njs,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  ParticlePairs local_78;
  
  ParticlePairs::ParticlePairs<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((ParticlePairs *)&local_78,it,end,lineNumber,MAT,MF,MT);
  RMatrixLimited<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (this,ifg,krl,krm,&local_78,njs,it,end,lineNumber,MAT,MF,MT);
  if (local_78.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super_ListRecord.data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super_ListRecord.data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

RMatrixLimited( bool ifg, bool krl, int krm, int njs,
                Iterator& it, const Iterator& end, long& lineNumber,
                int MAT, int MF, int MT ) :
  RMatrixLimited( ifg, krl, krm,
                  ParticlePairs( it, end, lineNumber, MAT, MF, MT ), njs,
                  it, end, lineNumber, MAT, MF, MT ) {}